

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

Vec_Wrd_t * Abc_SuppGenPairs(Vec_Wrd_t *p,int nBits)

{
  ulong *puVar1;
  uint uVar2;
  char cVar3;
  ulong *puVar4;
  Vec_Wrd_t *p_00;
  void *__ptr;
  long lVar5;
  ulong Entry;
  ulong *puVar6;
  ulong *puVar7;
  
  p_00 = Vec_WrdAlloc(1000);
  cVar3 = '\x05';
  if (5 < nBits) {
    cVar3 = (char)nBits;
  }
  __ptr = calloc((long)(1 << (cVar3 - 5U & 0x1f)),4);
  puVar1 = p->pArray + p->nSize;
  puVar4 = p->pArray;
  while (puVar6 = puVar4, puVar6 < puVar1) {
    for (puVar7 = puVar6 + 1; puVar4 = puVar6 + 1, puVar7 < puVar1; puVar7 = puVar7 + 1) {
      Entry = *puVar7 ^ *puVar6;
      lVar5 = (long)((int)(uint)Entry >> 5);
      uVar2 = *(uint *)((long)__ptr + lVar5 * 4);
      if ((uVar2 >> ((uint)Entry & 0x1f) & 1) == 0) {
        *(uint *)((long)__ptr + lVar5 * 4) = 1 << ((byte)Entry & 0x1f) ^ uVar2;
        Vec_WrdPush(p_00,Entry);
      }
    }
  }
  free(__ptr);
  return p_00;
}

Assistant:

Vec_Wrd_t * Abc_SuppGenPairs( Vec_Wrd_t * p, int nBits )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    unsigned * pMap = ABC_CALLOC( unsigned, 1 << Abc_MaxInt(0,nBits-5) ); 
    word * pLimit = Vec_WrdLimit(p);
    word * pEntry1 = Vec_WrdArray(p);
    word * pEntry2, Value;
    for ( ; pEntry1 < pLimit; pEntry1++ )
    for ( pEntry2 = pEntry1 + 1; pEntry2 < pLimit; pEntry2++ )
    {
        Value = *pEntry1 ^ *pEntry2;
        if ( Abc_InfoHasBit(pMap, (int)Value) )
            continue;
        Abc_InfoXorBit( pMap, (int)Value );
        Vec_WrdPush( vRes, Value );
    }
    ABC_FREE( pMap );
    return vRes;
}